

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O3

void __thiscall Simplex::checkBasis(Simplex *this)

{
  int iVar1;
  longdouble *a;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  longdouble lVar5;
  
  fwrite("Check basis:\n",0xd,1,_stderr);
  lVar4 = (long)this->m;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar2 = lVar4 << 4;
  }
  a = (longdouble *)operator_new__(uVar2);
  if (0 < lVar4) {
    uVar2 = 0;
    do {
      calcBInvRow(this,a,(int)uVar2);
      iVar1 = this->m;
      lVar4 = (long)iVar1;
      if (0 < lVar4) {
        uVar3 = 0;
        do {
          lVar5 = (longdouble)0;
          if (0 < (long)this->AV_nz[this->rtoc[uVar3]]) {
            lVar4 = 0;
            do {
              lVar5 = *(longdouble *)((long)&this->AV[this->rtoc[uVar3]]->field_0 + lVar4) *
                      a[*(int *)((long)&this->AV[this->rtoc[uVar3]]->field_0 + lVar4 + 0xc)] + lVar5
              ;
              lVar4 = lVar4 + 0x10;
            } while ((long)this->AV_nz[this->rtoc[uVar3]] * 0x10 != lVar4);
          }
          if (uVar2 == uVar3) {
            lVar5 = lVar5 + -(longdouble)1;
          }
          if ((longdouble)1e-06 <= ABS(lVar5)) {
            fprintf(_stderr,"%d:%d:%.2Lf ",uVar2 & 0xffffffff,uVar3 & 0xffffffff,in_R8,in_R9,lVar5);
            iVar1 = this->m;
          }
          uVar3 = uVar3 + 1;
          lVar4 = (long)iVar1;
        } while ((long)uVar3 < lVar4);
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < lVar4);
  }
  operator_delete__(a);
  return;
}

Assistant:

void Simplex::checkBasis() {
	//	printTableau(true);
	fprintf(stderr, "Check basis:\n");
	//	long double temp[m];
	auto* temp = new long double[m];
	for (int i = 0; i < m; i++) {
		calcBInvRow(temp, i);
		for (int j = 0; j < m; j++) {
			long double sum = 0;
			for (int k = 0; k < AV_nz[rtoc[j]]; k++) {
				sum += temp[AV[rtoc[j]][k].index()] * AV[rtoc[j]][k].val();
			}
			if (i == j) {
				sum -= 1;
			}
			if (!almostZero6(sum)) {
				fprintf(stderr, "%d:%d:%.2Lf ", i, j, sum);
			}
			assert(almostZero6(sum));
		}
		//		fprintf(stderr, "\n");
	}
	delete[] temp;
}